

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

void __thiscall nuraft::buffer_serializer::put_cstr(buffer_serializer *this,char *str)

{
  size_t sVar1;
  byte *pbVar2;
  overflow_error *this_00;
  byte bVar3;
  size_t sVar4;
  byte *pbVar5;
  
  sVar4 = this->pos_;
  sVar1 = buffer::size(this->buf_);
  pbVar2 = buffer::data_begin(this->buf_);
  bVar3 = *str;
  if (bVar3 != '\0') {
    pbVar5 = (byte *)(str + 1);
    do {
      if (sVar1 <= sVar4) {
        this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_00,"not enough space");
        goto LAB_00173fe6;
      }
      pbVar2[sVar4] = bVar3;
      sVar4 = sVar4 + 1;
      bVar3 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar3 != '\0');
  }
  if (sVar4 < sVar1) {
    pbVar2[sVar4] = '\0';
    pos(this,sVar4 + 1);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
LAB_00173fe6:
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_cstr(const char* str) {
    size_t local_pos = pos_;
    size_t buf_size = buf_.size();
    char* ptr = (char*)buf_.data_begin();

    size_t ii = 0;
    while (str[ii] != 0x0) {
        if (local_pos >= buf_size) {
            throw std::overflow_error("not enough space");
        }
        ptr[local_pos] = str[ii];
        local_pos++;
        ii++;
    }
    // Put NULL character at the end.
    if (local_pos >= buf_size) {
        throw std::overflow_error("not enough space");
    }
    ptr[local_pos++] = 0x0;
    pos( local_pos );
}